

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

void ps_table_done(PS_Table table)

{
  FT_Byte *old_base_00;
  FT_Pointer pvVar1;
  FT_Byte *old_base;
  FT_Memory pFStack_18;
  FT_Error error;
  FT_Memory memory;
  PS_Table table_local;
  
  pFStack_18 = table->memory;
  old_base_00 = table->block;
  if (old_base_00 != (FT_Byte *)0x0) {
    memory = (FT_Memory)table;
    pvVar1 = ft_mem_alloc(pFStack_18,table->cursor,(FT_Error *)((long)&old_base + 4));
    memory->user = pvVar1;
    if (old_base._4_4_ == 0) {
      memcpy(memory->user,old_base_00,(size_t)memory->alloc);
      shift_elements((PS_Table)memory,old_base_00);
      memory->free = (FT_Free_Func)memory->alloc;
      ft_mem_free(pFStack_18,old_base_00);
    }
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  ps_table_done( PS_Table  table )
  {
    FT_Memory  memory = table->memory;
    FT_Error   error;
    FT_Byte*   old_base = table->block;


    /* should never fail, because rec.cursor <= rec.size */
    if ( !old_base )
      return;

    if ( FT_ALLOC( table->block, table->cursor ) )
      return;
    FT_MEM_COPY( table->block, old_base, table->cursor );
    shift_elements( table, old_base );

    table->capacity = table->cursor;
    FT_FREE( old_base );

    FT_UNUSED( error );
  }